

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

SHWBufferLink * __thiscall
irr::video::COpenGLDriver::createHardwareBuffer(COpenGLDriver *this,IMeshBuffer *mb)

{
  list<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
  *__position;
  int iVar1;
  u32 uVar2;
  E_HARDWARE_MAPPING EVar3;
  SHWBufferLink_opengl *this_00;
  iterator iVar4;
  SHWBufferLink_opengl *local_20;
  
  if ((mb != (IMeshBuffer *)0x0) &&
     ((iVar1 = (*mb->_vptr_IMeshBuffer[0x15])(mb), iVar1 != 0 ||
      (iVar1 = (*mb->_vptr_IMeshBuffer[0x14])(mb), iVar1 != 0)))) {
    this_00 = (SHWBufferLink_opengl *)operator_new(0x38);
    SHWBufferLink_opengl::SHWBufferLink_opengl(this_00,mb);
    __position = &(this->super_CNullDriver).HWBufferList;
    local_20 = this_00;
    iVar4 = ::std::__cxx11::
            list<irr::video::CNullDriver::SHWBufferLink*,std::allocator<irr::video::CNullDriver::SHWBufferLink*>>
            ::emplace<irr::video::CNullDriver::SHWBufferLink*>
                      ((list<irr::video::CNullDriver::SHWBufferLink*,std::allocator<irr::video::CNullDriver::SHWBufferLink*>>
                        *)__position,(const_iterator)__position,(SHWBufferLink **)&local_20);
    (this_00->super_SHWBufferLink).listPosition._M_node = iVar4._M_node;
    uVar2 = (*((this_00->super_SHWBufferLink).MeshBuffer)->_vptr_IMeshBuffer[0x18])();
    (this_00->super_SHWBufferLink).ChangedID_Vertex = uVar2;
    uVar2 = (*((this_00->super_SHWBufferLink).MeshBuffer)->_vptr_IMeshBuffer[0x19])();
    (this_00->super_SHWBufferLink).ChangedID_Index = uVar2;
    EVar3 = (*mb->_vptr_IMeshBuffer[0x14])(mb);
    (this_00->super_SHWBufferLink).Mapped_Vertex = EVar3;
    EVar3 = (*mb->_vptr_IMeshBuffer[0x15])(mb);
    (this_00->super_SHWBufferLink).Mapped_Index = EVar3;
    this_00->vbo_verticesID = 0;
    this_00->vbo_indicesID = 0;
    this_00->vbo_verticesSize = 0;
    this_00->vbo_indicesSize = 0;
    iVar1 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x6b])(this,this_00);
    if ((char)iVar1 != '\0') {
      return &this_00->super_SHWBufferLink;
    }
    (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x6d])(this,this_00);
  }
  return (SHWBufferLink *)0x0;
}

Assistant:

COpenGLDriver::SHWBufferLink *COpenGLDriver::createHardwareBuffer(const scene::IMeshBuffer *mb)
{
#if defined(GL_ARB_vertex_buffer_object)
	if (!mb || (mb->getHardwareMappingHint_Index() == scene::EHM_NEVER && mb->getHardwareMappingHint_Vertex() == scene::EHM_NEVER))
		return 0;

	SHWBufferLink_opengl *HWBuffer = new SHWBufferLink_opengl(mb);

	// add to map
	HWBuffer->listPosition = HWBufferList.insert(HWBufferList.end(), HWBuffer);

	HWBuffer->ChangedID_Vertex = HWBuffer->MeshBuffer->getChangedID_Vertex();
	HWBuffer->ChangedID_Index = HWBuffer->MeshBuffer->getChangedID_Index();
	HWBuffer->Mapped_Vertex = mb->getHardwareMappingHint_Vertex();
	HWBuffer->Mapped_Index = mb->getHardwareMappingHint_Index();
	HWBuffer->vbo_verticesID = 0;
	HWBuffer->vbo_indicesID = 0;
	HWBuffer->vbo_verticesSize = 0;
	HWBuffer->vbo_indicesSize = 0;

	if (!updateHardwareBuffer(HWBuffer)) {
		deleteHardwareBuffer(HWBuffer);
		return 0;
	}

	return HWBuffer;
#else
	return 0;
#endif
}